

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_s_unittest.cpp
# Opt level: O0

void __thiscall VectorSUnitTest_clear_Test::TestBody(VectorSUnitTest_clear_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  initializer_list<S> *local_240;
  AssertHelper local_238;
  Message local_230;
  uint local_224;
  undefined1 local_220 [8];
  AssertionResult gtest_ar_6;
  Message local_208;
  size_type local_200;
  unsigned_long local_1f8;
  undefined1 local_1f0 [8];
  AssertionResult gtest_ar_5;
  Message local_1d8;
  uint local_1cc;
  undefined1 local_1c8 [8];
  AssertionResult gtest_ar_4;
  Message local_1b0;
  uint local_1a4;
  undefined1 local_1a0 [8];
  AssertionResult gtest_ar_3;
  Message local_188;
  size_type local_180;
  uint local_174;
  undefined1 local_170 [8];
  AssertionResult gtest_ar_2;
  Message local_158;
  size_type local_150;
  uint local_144;
  undefined1 local_140 [8];
  AssertionResult gtest_ar_1;
  Message local_128;
  size_type local_120;
  uint local_114;
  undefined1 local_110 [8];
  AssertionResult gtest_ar;
  AssertHelper local_e0;
  Message local_d8;
  bool local_c9;
  undefined1 local_c8 [8];
  AssertionResult gtest_ar_;
  initializer_list<S> local_a0;
  S local_90;
  S local_88;
  initializer_list<S> local_80;
  undefined1 local_70 [8];
  vec_t v;
  VectorSUnitTest_clear_Test *this_local;
  
  v.data_ptr_ = (pointer)this;
  S::S((S *)&local_a0,1);
  S::S((S *)&local_a0._M_len,2);
  S::S(&local_90,3);
  S::S(&local_88,4);
  local_80._M_array = (iterator)&local_a0;
  local_80._M_len = 4;
  estl::vector_s<S,_10UL>::vector_s((vector_s<S,_10UL> *)local_70,&local_80);
  local_240 = &local_80;
  do {
    local_240 = (initializer_list<S> *)&local_240[-1]._M_len;
    S::~S((S *)local_240);
  } while (local_240 != &local_a0);
  local_c9 = estl::vector_s<S,_10UL>::empty((vector_s<S,_10UL> *)local_70);
  local_c9 = !local_c9;
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_c8,&local_c9,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c8);
  if (!bVar1) {
    testing::Message::Message(&local_d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar.message_,(internal *)local_c8,(AssertionResult *)0x19a12e,"true",
               "false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x204,pcVar2);
    testing::internal::AssertHelper::operator=(&local_e0,&local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(&local_d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c8);
  local_114 = 4;
  local_120 = estl::vector_s<S,_10UL>::size((vector_s<S,_10UL> *)local_70);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((EqHelper *)local_110,"4u","v.size()",&local_114,&local_120);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_110);
  if (!bVar1) {
    testing::Message::Message(&local_128);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_110);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x205,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_128);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_128);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_110);
  local_144 = 10;
  local_150 = estl::vector_s<S,_10UL>::capacity((vector_s<S,_10UL> *)local_70);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((EqHelper *)local_140,"10u","v.capacity()",&local_144,&local_150);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_140);
  if (!bVar1) {
    testing::Message::Message(&local_158);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_140);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x206,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_158);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_158);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_140);
  local_174 = 10;
  local_180 = estl::vector_s<S,_10UL>::max_size((vector_s<S,_10UL> *)local_70);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((EqHelper *)local_170,"10u","v.max_size()",&local_174,&local_180);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_170);
  if (!bVar1) {
    testing::Message::Message(&local_188);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_170);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x207,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_188);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_188);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_170);
  local_1a4 = 4;
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((EqHelper *)local_1a0,"4u","S::count_constructor",&local_1a4,&S::count_constructor);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a0);
  if (!bVar1) {
    testing::Message::Message(&local_1b0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x208,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_1b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_1b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a0);
  local_1cc = 4;
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((EqHelper *)local_1c8,"4u","S::count_destructor",&local_1cc,&S::count_destructor);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c8);
  if (!bVar1) {
    testing::Message::Message(&local_1d8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x209,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_1d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_1d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c8);
  estl::vector_s<S,_10UL>::clear((vector_s<S,_10UL> *)local_70);
  local_1f8 = 0;
  local_200 = estl::vector_s<S,_10UL>::size((vector_s<S,_10UL> *)local_70);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((EqHelper *)local_1f0,"static_cast<size_t>(0u)","v.size()",&local_1f8,&local_200);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f0);
  if (!bVar1) {
    testing::Message::Message(&local_208);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x20b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_208);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_208);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f0);
  local_224 = 8;
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((EqHelper *)local_220,"8u","S::count_destructor",&local_224,&S::count_destructor);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_220);
  if (!bVar1) {
    testing::Message::Message(&local_230);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_220);
    testing::internal::AssertHelper::AssertHelper
              (&local_238,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x20c,pcVar2);
    testing::internal::AssertHelper::operator=(&local_238,&local_230);
    testing::internal::AssertHelper::~AssertHelper(&local_238);
    testing::Message::~Message(&local_230);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_220);
  estl::vector_s<S,_10UL>::~vector_s((vector_s<S,_10UL> *)local_70);
  return;
}

Assistant:

TEST_F(VectorSUnitTest, clear)
{
    using vec_t = vector_s<S, 10>;
    vec_t v{S(1u),S(2u),S(3u),S(4u)};
    EXPECT_FALSE(v.empty());
    EXPECT_EQ(4u, v.size());
    EXPECT_EQ(10u, v.capacity());
    EXPECT_EQ(10u, v.max_size());
    EXPECT_EQ(4u, S::count_constructor);
    EXPECT_EQ(4u, S::count_destructor);
    v.clear();
    EXPECT_EQ(static_cast<size_t>(0u), v.size());
    EXPECT_EQ(8u, S::count_destructor);
}